

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O2

void h265e_dpb_dump_frm(H265eDpb *dpb,char *fmt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char buf [256];
  
  iVar1 = snprintf(buf,0xff,"total %2d ");
  for (lVar3 = 0; lVar3 != 0x660; lVar3 = lVar3 + 0x60) {
    iVar2 = snprintf(buf + iVar1,0xff - (long)iVar1,"%04x ");
    iVar1 = iVar1 + iVar2;
  }
  _mpp_log_l(4,"h265e_dpb","%20s %s",(char *)0x0,fmt,buf);
  return;
}

Assistant:

void h265e_dpb_dump_frm(H265eDpb *dpb, const char *fmt)
{
    RK_S32 i = 0;
    char buf[256];
    RK_S32 pos = 0;
    RK_S32 frm_cnt = MPP_ARRAY_ELEMS(dpb->frame_list);

    pos += snprintf(buf, sizeof(buf) - 1, "total %2d ", frm_cnt);

    for (i = 0; i < frm_cnt; i++) {
        H265eDpbFrm *frm = &dpb->frame_list[i];

        pos += snprintf(buf + pos, sizeof(buf) - 1 - pos, "%04x ", frm->on_used);
    }
    mpp_log("%20s %s", fmt, buf);
}